

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_rerolled_array_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,string *base_expr,SPIRType *type)

{
  uint32_t uVar1;
  SPIRType *type_00;
  char (*in_R9) [2];
  uint __val;
  string subexpr;
  string local_70;
  string local_50;
  
  uVar1 = to_array_size_literal(this,type);
  type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(type->parent_type).id);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,"{ ",(allocator *)&local_50);
  __val = 0;
  while (uVar1 != __val) {
    ::std::__cxx11::to_string(&local_70,__val);
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (&local_50,(spirv_cross *)base_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37d448,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3759d6,in_R9);
    ::std::__cxx11::string::~string((string *)&local_70);
    if ((type_00->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      to_rerolled_array_expression(&local_70,this,&local_50,type_00);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_70);
    }
    __val = __val + 1;
    if (__val < uVar1) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_rerolled_array_expression(const string &base_expr, const SPIRType &type)
{
	uint32_t size = to_array_size_literal(type);
	auto &parent = get<SPIRType>(type.parent_type);
	string expr = "{ ";

	for (uint32_t i = 0; i < size; i++)
	{
		auto subexpr = join(base_expr, "[", convert_to_string(i), "]");
		if (parent.array.empty())
			expr += subexpr;
		else
			expr += to_rerolled_array_expression(subexpr, parent);

		if (i + 1 < size)
			expr += ", ";
	}

	expr += " }";
	return expr;
}